

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          local_datetime_type *dt,local_datetime_format_info *fmt,source_location *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  datetime_delimiter_kind dVar4;
  pointer pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined8 uVar7;
  ostringstream oss;
  string_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  undefined8 uStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  toml::operator<<((ostream *)local_1a8,&dt->date);
  dVar4 = fmt->delimiter;
  if (dVar4 == upper_T) {
    local_208._M_dataplus._M_p._0_1_ = 0x54;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_208,1);
  }
  else if (dVar4 == lower_t) {
    local_208._M_dataplus._M_p._0_1_ = 0x74;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_208,1);
  }
  else if (dVar4 == space) {
    local_208._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_208,1);
  }
  else {
    local_208._M_dataplus._M_p._0_1_ = 0x54;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_208,1);
  }
  std::__cxx11::stringbuf::str();
  local_1c8._M_string_length = local_1e0;
  paVar2 = &local_208.field_2;
  if (local_1e8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_1d8) {
    local_208.field_2._8_8_ = uStack_1d0;
    local_208._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_208._M_dataplus._M_p = (pointer)local_1e8;
  }
  local_208.field_2._M_allocated_capacity._1_7_ = uStack_1d7;
  local_208.field_2._M_local_buf[0] = local_1d8;
  local_208._M_string_length = local_1e0;
  local_1e0 = 0;
  local_1d8 = '\0';
  paVar3 = &local_1c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p == paVar2) {
    local_1c8.field_2._8_8_ = local_208.field_2._8_8_;
    local_1c8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_1c8._M_dataplus._M_p = local_208._M_dataplus._M_p;
  }
  local_1c8.field_2._M_allocated_capacity = local_208.field_2._M_allocated_capacity;
  local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_1d8;
  format_local_time_abi_cxx11_(&local_208,this,&dt->time,fmt->has_seconds,fmt->subsecond_precision);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar3) {
    uVar7 = local_1c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_208._M_string_length + local_1c8._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      uVar7 = local_208.field_2._M_allocated_capacity;
    }
    if (local_208._M_string_length + local_1c8._M_string_length <= (ulong)uVar7) {
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_208,0,0,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      goto LAB_003a03e7;
    }
  }
  pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1c8,local_208._M_dataplus._M_p,local_208._M_string_length);
LAB_003a03e7:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar5 = (pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const local_datetime_type& dt, const local_datetime_format_info& fmt, const source_location&) // {{{
    {
        std::ostringstream oss;
        oss << dt.date;
        switch(fmt.delimiter)
        {
            case datetime_delimiter_kind::upper_T: { oss << 'T'; break; }
            case datetime_delimiter_kind::lower_t: { oss << 't'; break; }
            case datetime_delimiter_kind::space:   { oss << ' '; break; }
            default:                               { oss << 'T'; break; }
        }
        return string_conv<string_type>(oss.str()) +
            this->format_local_time(dt.time, fmt.has_seconds, fmt.subsecond_precision);
    }